

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
Mips64Disassembler_getInstruction
          (int mode,MCInst *instr,uint8_t *code,size_t code_len,uint16_t *Size,uint64_t Address,
          _Bool isBigEndian,MCRegisterInfo *MRI)

{
  DecodeStatus DVar1;
  uint32_t local_40;
  DecodeStatus Result;
  uint32_t Insn;
  _Bool isBigEndian_local;
  uint64_t Address_local;
  uint16_t *Size_local;
  size_t code_len_local;
  uint8_t *code_local;
  MCInst *instr_local;
  int mode_local;
  
  Result._3_1_ = isBigEndian;
  _Insn = Address;
  Address_local = (uint64_t)Size;
  Size_local = (uint16_t *)code_len;
  code_len_local = (size_t)code;
  code_local = (uint8_t *)instr;
  instr_local._0_4_ = mode;
  DVar1 = readInstruction32(code,&local_40,isBigEndian,false);
  if (DVar1 == MCDisassembler_Fail) {
    instr_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    if (*(long *)(*(long *)(code_local + 0x310) + 0xe8) != 0) {
      memset(*(void **)(*(long *)(code_local + 0x310) + 0xe8),0,0x5f8);
    }
    instr_local._4_4_ =
         decodeInstruction(DecoderTableMips6432,(MCInst *)code_local,local_40,_Insn,MRI,
                           (int)instr_local);
    if (instr_local._4_4_ == MCDisassembler_Fail) {
      instr_local._4_4_ =
           decodeInstruction(DecoderTableMips32,(MCInst *)code_local,local_40,_Insn,MRI,
                             (int)instr_local);
      if (instr_local._4_4_ == MCDisassembler_Fail) {
        instr_local._4_4_ = MCDisassembler_Fail;
      }
      else {
        *(undefined2 *)Address_local = 4;
      }
    }
    else {
      *(undefined2 *)Address_local = 4;
    }
  }
  return instr_local._4_4_;
}

Assistant:

static DecodeStatus Mips64Disassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;

	DecodeStatus Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian, false);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips6432, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	// If we fail to decode in Mips64 decoder space we can try in Mips32
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}